

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

uint16_t icu_63::getExtName(uint32_t code,char *buffer,uint16_t bufferLength)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  char *pcVar4;
  char cVar5;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  uint16_t uVar10;
  bool bVar11;
  
  bVar1 = getCharCat(code);
  if (bVar1 < 0x21) {
    pcVar4 = (&charCatNames)[bVar1];
  }
  else {
    pcVar4 = "unknown";
  }
  if (bufferLength != 0) {
    *buffer = '<';
    buffer = buffer + 1;
    bufferLength = bufferLength - 1;
  }
  sVar2 = 3;
  cVar5 = *pcVar4;
  while (cVar5 != '\0') {
    if (bufferLength != 0) {
      *buffer = cVar5;
      buffer = buffer + 1;
      bufferLength = bufferLength - 1;
    }
    uVar6 = sVar2 - 1;
    sVar2 = sVar2 + 1;
    cVar5 = pcVar4[(ulong)uVar6 - 1];
  }
  if (bufferLength != 0) {
    *buffer = '-';
    buffer = buffer + 1;
    bufferLength = bufferLength - 1;
  }
  uVar7 = 0;
  uVar3 = code;
  if (code != 0) {
    do {
      uVar7 = uVar7 + 1;
      bVar11 = 0xf < uVar3;
      uVar3 = (int)uVar3 >> 4;
    } while (bVar11);
  }
  uVar3 = 4;
  if (4 < uVar7) {
    uVar3 = uVar7;
  }
  if ((0 < (int)uVar3 || code != 0) && (bufferLength != 0)) {
    lVar8 = (long)(int)uVar3;
    uVar10 = bufferLength;
    do {
      cVar5 = (char)(code & 0xf);
      cVar9 = cVar5 + '7';
      if ((code & 0xf) < 10) {
        cVar9 = cVar5 + '0';
      }
      buffer[lVar8 + -1] = cVar9;
      bufferLength = uVar10 - 1;
      if (code < 0x10 && lVar8 < 2) break;
      lVar8 = lVar8 + -1;
      code = (int)code >> 4;
      bVar11 = uVar10 != 1;
      uVar10 = bufferLength;
    } while (bVar11);
  }
  if (bufferLength != 0) {
    buffer[uVar3] = '>';
  }
  return sVar2 + (short)uVar3;
}

Assistant:

static uint16_t getExtName(uint32_t code, char *buffer, uint16_t bufferLength) {
    const char *catname = getCharCatName(code);
    uint16_t length = 0;

    UChar32 cp;
    int ndigits, i;
    
    WRITE_CHAR(buffer, bufferLength, length, '<');
    while (catname[length - 1]) {
        WRITE_CHAR(buffer, bufferLength, length, catname[length - 1]);
    }
    WRITE_CHAR(buffer, bufferLength, length, '-');
    for (cp = code, ndigits = 0; cp; ++ndigits, cp >>= 4)
        ;
    if (ndigits < 4)
        ndigits = 4;
    for (cp = code, i = ndigits; (cp || i > 0) && bufferLength; cp >>= 4, bufferLength--) {
        uint8_t v = (uint8_t)(cp & 0xf);
        buffer[--i] = (v < 10 ? '0' + v : 'A' + v - 10);
    }
    buffer += ndigits;
    length += static_cast<uint16_t>(ndigits);
    WRITE_CHAR(buffer, bufferLength, length, '>');

    return length;
}